

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_math.c
# Opt level: O0

realtype SUNRpowerR(realtype base,realtype exponent)

{
  double in_XMM0_Qa;
  double in_XMM1_Qa;
  undefined8 local_8;
  
  if (0.0 < in_XMM0_Qa) {
    local_8 = pow(in_XMM0_Qa,in_XMM1_Qa);
  }
  else {
    local_8 = 0.0;
  }
  return local_8;
}

Assistant:

realtype SUNRpowerR(realtype base, realtype exponent)
{
  if (base <= RCONST(0.0)) return(RCONST(0.0));

#if defined(SUNDIALS_USE_GENERIC_MATH)
  return((realtype) pow((double) base, (double) exponent));
#elif defined(SUNDIALS_DOUBLE_PRECISION)
  return(pow(base, exponent));
#elif defined(SUNDIALS_SINGLE_PRECISION)
  return(powf(base, exponent));
#elif defined(SUNDIALS_EXTENDED_PRECISION)
  return(powl(base, exponent));
#endif
}